

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O2

void susolve(int ldm,int ncol,float *M,float *rhs)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  long lVar7;
  
  lVar3 = (long)ncol;
  iVar4 = 0;
  iVar5 = 0;
  if (0 < ncol) {
    iVar5 = ncol;
  }
  pfVar6 = M + (lVar3 + -1) * (long)ldm;
  for (; iVar4 != iVar5; iVar4 = iVar4 + 1) {
    lVar3 = lVar3 + -1;
    fVar1 = rhs[lVar3];
    fVar2 = M[lVar3 + (int)lVar3 * ldm];
    rhs[lVar3] = fVar1 / fVar2;
    for (lVar7 = 0; lVar7 < lVar3; lVar7 = lVar7 + 1) {
      rhs[lVar7] = pfVar6[lVar7] * -(fVar1 / fVar2) + rhs[lVar7];
    }
    pfVar6 = pfVar6 + -(long)ldm;
  }
  return;
}

Assistant:

void
susolve (int ldm, int ncol, float *M, float *rhs)
{
    float xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}